

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O1

bool __thiscall
basist::basisu_transcoder::transcode_image_level
          (basisu_transcoder *this,void *pData,uint32_t data_size,uint32_t image_index,
          uint32_t level_index,void *pOutput_blocks,
          uint32_t output_blocks_buf_size_in_blocks_or_pixels,transcoder_texture_format fmt,
          uint32_t decode_flags,uint32_t output_row_pitch_in_blocks_or_pixels,
          basisu_transcoder_state *pState,uint32_t output_rows_in_pixels)

{
  byte bVar1;
  uint uVar2;
  transcoder_texture_format target_format;
  long lVar3;
  bool bVar4;
  uint32_t uVar5;
  uint uVar6;
  uint32_t data_size_00;
  basisu_transcoder *this_00;
  long lVar7;
  uint32_t alpha_length;
  uint32_t in_stack_ffffffffffffff38;
  basisu_transcoder_state *in_stack_ffffffffffffff70;
  
  this_00 = (basisu_transcoder *)(ulong)fmt;
  uVar5 = basis_get_bytes_per_block_or_pixel(fmt);
  if ((((decode_flags & 2) == 0) && (this->m_ready_to_transcode != false)) &&
     (bVar4 = validate_header_quick(this_00,pData,data_size), bVar4)) {
    uVar2 = *(uint *)((long)pData + 0x41);
    bVar1 = *(byte *)((long)pData + 0x15);
    uVar6 = find_first_slice_index(this_00,pData,data_size_00,image_index,level_index);
    if (-1 < (int)uVar6) {
      bVar4 = (bool)((bVar1 & 4) >> 2);
      target_format = bVar4 + cTFPVRTC1_4_RGB;
      if (fmt != cTFPVRTC1_4_RGBA) {
        target_format = fmt;
      }
      if (*(char *)((long)pData + 0x14) != '\0') {
LAB_00148cc2:
        lVar3 = (ulong)uVar6 * 0x17;
        if ((target_format & ~cTFETC2) == cTFPVRTC1_4_RGB) {
          uVar6 = (uint)*(ushort *)((long)pData + lVar3 + (ulong)uVar2 + 0xb) *
                  (uint)*(ushort *)((long)pData + lVar3 + (ulong)uVar2 + 9);
          if (uVar6 <= output_blocks_buf_size_in_blocks_or_pixels &&
              output_blocks_buf_size_in_blocks_or_pixels - uVar6 != 0) {
            memset((void *)((ulong)(uVar6 * uVar5) + (long)pOutput_blocks),0,
                   (ulong)((output_blocks_buf_size_in_blocks_or_pixels - uVar6) * uVar5));
          }
        }
        lVar3 = lVar3 + (ulong)uVar2;
        if (*(char *)((long)pData + 0x14) == '\x01') {
          uVar2 = *(uint *)((long)pData + lVar3 + 0xd);
          bVar4 = basisu_lowlevel_uastc_transcoder::transcode_image
                            ((basisu_lowlevel_uastc_transcoder *)(ulong)uVar2,target_format,
                             pOutput_blocks,output_blocks_buf_size_in_blocks_or_pixels,
                             (uint8_t *)pData,data_size,(uint)*(ushort *)((long)pData + lVar3 + 9),
                             (uint)*(ushort *)((long)pData + lVar3 + 0xb),
                             (uint)*(ushort *)((long)pData + lVar3 + 5),
                             (uint)*(ushort *)((long)pData + lVar3 + 7),in_stack_ffffffffffffff38,
                             uVar2,*(uint32_t *)((long)pData + lVar3 + 0x11),decode_flags,bVar4,
                             false,output_row_pitch_in_blocks_or_pixels,in_stack_ffffffffffffff70,
                             output_rows_in_pixels,-1,-1);
          return bVar4;
        }
        lVar7 = 0;
        if ((bVar1 & 4) != 0) {
          lVar7 = (long)pData + lVar3 + 0x17;
        }
        if ((*(byte *)((long)pData + lVar3 + 4) & 1) != 0) {
          __assert_fail("(pSlice_desc->m_flags & cSliceDescFlagsHasAlpha) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                        ,0x2a0a,
                        "bool basist::basisu_transcoder::transcode_image_level(const void *, uint32_t, uint32_t, uint32_t, void *, uint32_t, transcoder_texture_format, uint32_t, uint32_t, basisu_transcoder_state *, uint32_t) const"
                       );
        }
        if ((bVar1 & 4) != 0) {
          if ((*(byte *)(lVar7 + 4) & 1) == 0) {
            __assert_fail("(pAlpha_slice_desc->m_flags & cSliceDescFlagsHasAlpha) != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                          ,0x2a0f,
                          "bool basist::basisu_transcoder::transcode_image_level(const void *, uint32_t, uint32_t, uint32_t, void *, uint32_t, transcoder_texture_format, uint32_t, uint32_t, basisu_transcoder_state *, uint32_t) const"
                         );
          }
          if (*(short *)((long)pData + lVar3 + 9) != *(short *)(lVar7 + 9)) {
            __assert_fail("pSlice_desc->m_num_blocks_x == pAlpha_slice_desc->m_num_blocks_x",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                          ,0x2a10,
                          "bool basist::basisu_transcoder::transcode_image_level(const void *, uint32_t, uint32_t, uint32_t, void *, uint32_t, transcoder_texture_format, uint32_t, uint32_t, basisu_transcoder_state *, uint32_t) const"
                         );
          }
          if (*(short *)((long)pData + lVar3 + 0xb) != *(short *)(lVar7 + 0xb)) {
            __assert_fail("pSlice_desc->m_num_blocks_y == pAlpha_slice_desc->m_num_blocks_y",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                          ,0x2a11,
                          "bool basist::basisu_transcoder::transcode_image_level(const void *, uint32_t, uint32_t, uint32_t, void *, uint32_t, transcoder_texture_format, uint32_t, uint32_t, basisu_transcoder_state *, uint32_t) const"
                         );
          }
          if (*(char *)((long)pData + lVar3 + 3) != *(char *)(lVar7 + 3)) {
            __assert_fail("pSlice_desc->m_level_index == pAlpha_slice_desc->m_level_index",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                          ,0x2a12,
                          "bool basist::basisu_transcoder::transcode_image_level(const void *, uint32_t, uint32_t, uint32_t, void *, uint32_t, transcoder_texture_format, uint32_t, uint32_t, basisu_transcoder_state *, uint32_t) const"
                         );
          }
        }
        alpha_length = 0;
        uVar5 = 0;
        if ((bVar1 & 4) != 0) {
          uVar5 = *(uint32_t *)(lVar7 + 0xd);
        }
        if ((bVar1 & 4) != 0) {
          alpha_length = *(uint32_t *)(lVar7 + 0x11);
        }
        bVar4 = basisu_lowlevel_etc1s_transcoder::transcode_image
                          (&this->m_lowlevel_etc1s_decoder,target_format,pOutput_blocks,
                           output_blocks_buf_size_in_blocks_or_pixels,(uint8_t *)pData,data_size,
                           (uint)*(ushort *)((long)pData + lVar3 + 9),
                           (uint)*(ushort *)((long)pData + lVar3 + 0xb),
                           (uint)*(ushort *)((long)pData + lVar3 + 5),
                           (uint)*(ushort *)((long)pData + lVar3 + 7),
                           (uint)*(byte *)((long)pData + lVar3 + 3),
                           *(uint32_t *)((long)pData + lVar3 + 0xd),
                           *(uint32_t *)((long)pData + lVar3 + 0x11),uVar5,alpha_length,decode_flags
                           ,bVar4,*(char *)((long)pData + 0x17) == '\x03',
                           output_row_pitch_in_blocks_or_pixels,pState,output_rows_in_pixels);
        return bVar4;
      }
      lVar3 = (ulong)uVar6 * 0x17;
      if ((*(byte *)((long)pData + lVar3 + (ulong)uVar2 + 4) & 1) == 0) {
        if ((bVar1 & 4) == 0) goto LAB_00148cc2;
        if ((uVar6 + 1 <
             ((uint)*(byte *)((long)pData + 0xe) |
             (uint)*(byte *)((long)pData + 0xf) << 8 | (uint)*(byte *)((long)pData + 0x10) << 0x10))
           && (lVar7 = (long)(int)(uVar6 + 1) * 0x17,
              (*(byte *)((long)pData + lVar7 + (ulong)uVar2 + 4) & 1) != 0)) {
          lVar3 = lVar3 + (ulong)uVar2;
          lVar7 = lVar7 + (ulong)uVar2;
          if ((*(short *)((long)pData + lVar3 + 9) == *(short *)((long)pData + lVar7 + 9)) &&
             (*(short *)((long)pData + lVar3 + 0xb) == *(short *)((long)pData + lVar7 + 0xb)))
          goto LAB_00148cc2;
        }
      }
    }
  }
  return false;
}

Assistant:

bool basisu_transcoder::transcode_image_level(
		const void* pData, uint32_t data_size,
		uint32_t image_index, uint32_t level_index,
		void* pOutput_blocks, uint32_t output_blocks_buf_size_in_blocks_or_pixels,
		transcoder_texture_format fmt,
		uint32_t decode_flags, uint32_t output_row_pitch_in_blocks_or_pixels, basisu_transcoder_state *pState, uint32_t output_rows_in_pixels) const
	{
		const uint32_t bytes_per_block_or_pixel = basis_get_bytes_per_block_or_pixel(fmt);

		if (!m_ready_to_transcode)
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::transcode_image_level: must call start_transcoding() first\n");
			return false;
		}

		//const bool transcode_alpha_data_to_opaque_formats = (decode_flags & cDecodeFlagsTranscodeAlphaDataToOpaqueFormats) != 0;

		if (decode_flags & cDecodeFlagsPVRTCDecodeToNextPow2)
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::transcode_image_level: cDecodeFlagsPVRTCDecodeToNextPow2 currently unsupported\n");
			// TODO: Not yet supported
			return false;
		}

		if (!validate_header_quick(pData, data_size))
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::transcode_image_level: header validation failed\n");
			return false;
		}

		const basis_file_header* pHeader = reinterpret_cast<const basis_file_header*>(pData);

		const uint8_t* pDataU8 = static_cast<const uint8_t*>(pData);

		const basis_slice_desc* pSlice_descs = reinterpret_cast<const basis_slice_desc*>(pDataU8 + pHeader->m_slice_desc_file_ofs);

		const bool basis_file_has_alpha_slices = (pHeader->m_flags & cBASISHeaderFlagHasAlphaSlices) != 0;

		int slice_index = find_first_slice_index(pData, data_size, image_index, level_index);
		if (slice_index < 0)
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::transcode_image_level: failed finding slice index\n");
			// Unable to find the requested image/level 
			return false;
		}

		if ((fmt == transcoder_texture_format::cTFPVRTC1_4_RGBA) && (!basis_file_has_alpha_slices))
		{
			// Switch to PVRTC1 RGB if the input doesn't have alpha.
			fmt = transcoder_texture_format::cTFPVRTC1_4_RGB;
		}
				
		if (pHeader->m_tex_format == (int)basis_tex_format::cETC1S)
		{
			if (pSlice_descs[slice_index].m_flags & cSliceDescFlagsHasAlpha)
			{
				BASISU_DEVEL_ERROR("basisu_transcoder::transcode_image_level: alpha basis file has out of order alpha slice\n");

				// The first slice shouldn't have alpha data in a properly formed basis file
				return false;
			}

			if (basis_file_has_alpha_slices)
			{
				// The alpha data should immediately follow the color data, and have the same resolution.
				if ((slice_index + 1U) >= pHeader->m_total_slices)
				{
					BASISU_DEVEL_ERROR("basisu_transcoder::transcode_image_level: alpha basis file has missing alpha slice\n");
					// basis file is missing the alpha slice
					return false;
				}

				// Basic sanity checks
				if ((pSlice_descs[slice_index + 1].m_flags & cSliceDescFlagsHasAlpha) == 0)
				{
					BASISU_DEVEL_ERROR("basisu_transcoder::transcode_image_level: alpha basis file has missing alpha slice (flag check)\n");
					// This slice should have alpha data
					return false;
				}

				if ((pSlice_descs[slice_index].m_num_blocks_x != pSlice_descs[slice_index + 1].m_num_blocks_x) || (pSlice_descs[slice_index].m_num_blocks_y != pSlice_descs[slice_index + 1].m_num_blocks_y))
				{
					BASISU_DEVEL_ERROR("basisu_transcoder::transcode_image_level: alpha basis file slice dimensions bad\n");
					// Alpha slice should have been the same res as the color slice
					return false;
				}
			}
		}
								
		bool status = false;

		const uint32_t total_slice_blocks = pSlice_descs[slice_index].m_num_blocks_x * pSlice_descs[slice_index].m_num_blocks_y;

		if (((fmt == transcoder_texture_format::cTFPVRTC1_4_RGB) || (fmt == transcoder_texture_format::cTFPVRTC1_4_RGBA)) && (output_blocks_buf_size_in_blocks_or_pixels > total_slice_blocks))
		{
			// The transcoder doesn't write beyond total_slice_blocks, so we need to clear the rest ourselves.
			// For GL usage, PVRTC1 4bpp image size is (max(width, 8)* max(height, 8) * 4 + 7) / 8. 
			// However, for KTX and internally in Basis this formula isn't used, it's just ((width+3)/4) * ((height+3)/4) * bytes_per_block_or_pixel. This is all the transcoder actually writes to memory.
			memset(static_cast<uint8_t*>(pOutput_blocks) + total_slice_blocks * bytes_per_block_or_pixel, 0, (output_blocks_buf_size_in_blocks_or_pixels - total_slice_blocks) * bytes_per_block_or_pixel);
		}
		
		if (pHeader->m_tex_format == (int)basis_tex_format::cUASTC4x4)
		{
			const basis_slice_desc* pSlice_desc = &pSlice_descs[slice_index];

			// Use the container independent image transcode method.
			status = m_lowlevel_uastc_decoder.transcode_image(fmt,
				pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels,
				(const uint8_t*)pData, data_size, pSlice_desc->m_num_blocks_x, pSlice_desc->m_num_blocks_y, pSlice_desc->m_orig_width, pSlice_desc->m_orig_height, pSlice_desc->m_level_index,
				pSlice_desc->m_file_ofs, pSlice_desc->m_file_size,
				decode_flags, basis_file_has_alpha_slices, pHeader->m_tex_type == cBASISTexTypeVideoFrames, output_row_pitch_in_blocks_or_pixels, pState, output_rows_in_pixels);
		}
		else 
		{
			// ETC1S
			const basis_slice_desc* pSlice_desc = &pSlice_descs[slice_index];
			const basis_slice_desc* pAlpha_slice_desc = basis_file_has_alpha_slices ? &pSlice_descs[slice_index + 1] : nullptr;

			assert((pSlice_desc->m_flags & cSliceDescFlagsHasAlpha) == 0);

			if (pAlpha_slice_desc)
			{
				// Basic sanity checks
				assert((pAlpha_slice_desc->m_flags & cSliceDescFlagsHasAlpha) != 0);
				assert(pSlice_desc->m_num_blocks_x == pAlpha_slice_desc->m_num_blocks_x);
				assert(pSlice_desc->m_num_blocks_y == pAlpha_slice_desc->m_num_blocks_y);
				assert(pSlice_desc->m_level_index == pAlpha_slice_desc->m_level_index);
			}

			// Use the container independent image transcode method.
			status = m_lowlevel_etc1s_decoder.transcode_image(fmt,
				pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels,
				(const uint8_t *)pData, data_size, pSlice_desc->m_num_blocks_x, pSlice_desc->m_num_blocks_y, pSlice_desc->m_orig_width, pSlice_desc->m_orig_height, pSlice_desc->m_level_index,
				pSlice_desc->m_file_ofs, pSlice_desc->m_file_size,
				(pAlpha_slice_desc != nullptr) ? (uint32_t)pAlpha_slice_desc->m_file_ofs : 0U, (pAlpha_slice_desc != nullptr) ? (uint32_t)pAlpha_slice_desc->m_file_size : 0U,
				decode_flags, basis_file_has_alpha_slices, pHeader->m_tex_type == cBASISTexTypeVideoFrames, output_row_pitch_in_blocks_or_pixels, pState, output_rows_in_pixels);

		} // if (pHeader->m_tex_format == (int)basis_tex_format::cUASTC4x4)
      
      if (!status)
      {
         BASISU_DEVEL_ERROR("basisu_transcoder::transcode_image_level: Returning false\n");
      }
      else
      {
         //BASISU_DEVEL_ERROR("basisu_transcoder::transcode_image_level: Returning true\n");      
      }

		return status;
	}